

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fiber.c
# Opt level: O3

void coro__yield_test(sx_fiber_transfer __transfer)

{
  int iVar1;
  undefined8 *in_RSI;
  sx_fiber_t local_30 [2];
  
  puts("fiber_pass_fn: Start");
  puts("fiber_pass_fn: Pass and continue on next frame ..");
  sx__coro_yield((sx_coro_context *)*in_RSI,local_30,1);
  puts("fiber_pass_fn: Continue");
  puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
  sx__coro_yield((sx_coro_context *)*in_RSI,local_30,100);
  puts("fiber_pass_fn: Continue next 10 frames");
  iVar1 = 10;
  do {
    printf("fiber_pass_fn: Continue frame: %i\n",(ulong)*(uint *)(in_RSI + 1));
    sx__coro_yield((sx_coro_context *)*in_RSI,local_30,1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  puts("fiber_pass_fn: End");
  sx__coro_end((sx_coro_context *)*in_RSI,local_30);
  return;
}

Assistant:

sx_coro_declare(yield_test)
{
    coro_data* d = sx_coro_userdata();
    puts("fiber_pass_fn: Start");

    puts("fiber_pass_fn: Pass and continue on next frame ..");
    sx_coro_yield(d->ctx);
    puts("fiber_pass_fn: Continue");

    puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
    sx_coro_yieldn(d->ctx, 100);

    puts("fiber_pass_fn: Continue next 10 frames");
    int i = 0;
    while (i++ < 10) {
        printf("fiber_pass_fn: Continue frame: %i\n", d->frame);
        sx_coro_yield(d->ctx);
    }

    puts("fiber_pass_fn: End");
    sx_coro_end(d->ctx);    // Always call this !
}